

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

bool anon_unknown.dwarf_889438::IsDescriptorResource(TType *type)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  byte local_19;
  TType *type_local;
  
  iVar2 = (*type->_vptr_TType[7])();
  if (iVar2 == 0x10) {
    iVar2 = (*type->_vptr_TType[0xb])();
    bVar1 = glslang::TQualifier::isUniformOrBuffer((TQualifier *)CONCAT44(extraout_var,iVar2));
    local_19 = 0;
    if (bVar1) {
      iVar2 = (*type->_vptr_TType[0xb])();
      bVar1 = glslang::TQualifier::isShaderRecord((TQualifier *)CONCAT44(extraout_var_00,iVar2));
      local_19 = 0;
      if (!bVar1) {
        iVar2 = (*type->_vptr_TType[0xb])();
        bVar1 = glslang::TQualifier::isPushConstant((TQualifier *)CONCAT44(extraout_var_01,iVar2));
        local_19 = bVar1 ^ 0xff;
      }
    }
    type_local._7_1_ = (bool)(local_19 & 1);
  }
  else {
    iVar2 = (*type->_vptr_TType[7])();
    if ((iVar2 == 0xe) || (iVar2 = (*type->_vptr_TType[7])(), iVar2 == 0x11)) {
      iVar2 = (*type->_vptr_TType[0xb])();
      type_local._7_1_ =
           glslang::TQualifier::isUniformOrBuffer((TQualifier *)CONCAT44(extraout_var_02,iVar2));
    }
    else {
      type_local._7_1_ = false;
    }
  }
  return type_local._7_1_;
}

Assistant:

bool IsDescriptorResource(const glslang::TType& type)
{
    // uniform and buffer blocks are included, unless it is a push_constant
    if (type.getBasicType() == glslang::EbtBlock)
        return type.getQualifier().isUniformOrBuffer() &&
        ! type.getQualifier().isShaderRecord() &&
        ! type.getQualifier().isPushConstant();

    // non block...
    // basically samplerXXX/subpass/sampler/texture are all included
    // if they are the global-scope-class, not the function parameter
    // (or local, if they ever exist) class.
    if (type.getBasicType() == glslang::EbtSampler ||
        type.getBasicType() == glslang::EbtAccStruct)
        return type.getQualifier().isUniformOrBuffer();

    // None of the above.
    return false;
}